

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O2

int Abc_NodeCompareIndexes(Abc_Obj_t **pp1,Abc_Obj_t **pp2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (((*pp2)->field_6).iTemp <= ((*pp1)->field_6).iTemp) {
    uVar1 = (uint)(((*pp1)->field_6).iTemp != ((*pp2)->field_6).iTemp);
  }
  return uVar1;
}

Assistant:

int Abc_NodeCompareIndexes( Abc_Obj_t ** pp1, Abc_Obj_t ** pp2 )
{
    int Diff = (*pp1)->iTemp - (*pp2)->iTemp;
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}